

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

int loadbuffer(char *bname)

{
  int iVar1;
  buffer *pbVar2;
  char *fn;
  char *adjf;
  buffer *bufp;
  char *bname_local;
  
  if (*bname == '*') {
    pbVar2 = bfind(bname,0);
    if (pbVar2 == (buffer *)0x0) {
      bname_local._4_4_ = 0;
    }
    else {
      curbp = pbVar2;
      bname_local._4_4_ = showbuffer(pbVar2,curwp,8);
    }
  }
  else {
    fn = adjustname(bname,1);
    if (fn == (char *)0x0) {
      bname_local._4_4_ = 0;
    }
    else {
      pbVar2 = findbuffer(fn);
      if (pbVar2 == (buffer *)0x0) {
        bname_local._4_4_ = 0;
      }
      else {
        curbp = pbVar2;
        iVar1 = showbuffer(pbVar2,curwp,8);
        if (iVar1 == 1) {
          if ((pbVar2->b_fname[0] == '\0') && (iVar1 = readin(fn), iVar1 != 1)) {
            killbuffer(pbVar2);
            bname_local._4_4_ = 0;
          }
          else {
            bname_local._4_4_ = 1;
          }
        }
        else {
          bname_local._4_4_ = 0;
        }
      }
    }
  }
  return bname_local._4_4_;
}

Assistant:

int
loadbuffer(char *bname)
{
	struct buffer *bufp;
	char *adjf;

	/* check for special buffers which begin with '*' */
	if (bname[0] == '*') {
		if ((bufp = bfind(bname, FALSE)) != NULL) {
			curbp = bufp;
			return (showbuffer(bufp, curwp, WFFULL));
		} else {
			return (FALSE);
		}
	} else {
		if ((adjf = adjustname(bname, TRUE)) == NULL)
			return (FALSE);
		if ((bufp = findbuffer(adjf)) == NULL)
			return (FALSE);
	}
	curbp = bufp;
	if (showbuffer(bufp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bufp->b_fname[0] == '\0') {
		if (readin(adjf) != TRUE) {
			killbuffer(bufp);
			return (FALSE);
		}
	}
	return (TRUE);
}